

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int LEintfloat(lua_Integer i,lua_Number f)

{
  int iVar1;
  long local_28;
  lua_Integer fi;
  lua_Number f_local;
  lua_Integer i_local;
  
  if (i + 0x20000000000000U < 0x40000000000001) {
    i_local._4_4_ = (uint)((double)i <= f);
  }
  else {
    fi = (lua_Integer)f;
    f_local = (lua_Number)i;
    iVar1 = luaV_flttointeger(f,&local_28,F2Ifloor);
    if (iVar1 == 0) {
      i_local._4_4_ = (uint)(0.0 < (double)fi);
    }
    else {
      i_local._4_4_ = (uint)((long)f_local <= local_28);
    }
  }
  return i_local._4_4_;
}

Assistant:

static int LEintfloat (lua_Integer i, lua_Number f) {
  if (l_intfitsf(i))
    return luai_numle(cast_num(i), f);  /* compare them as floats */
  else {  /* i <= f <=> i <= floor(f) */
    lua_Integer fi;
    if (luaV_flttointeger(f, &fi, F2Ifloor))  /* fi = floor(f) */
      return i <= fi;   /* compare them as integers */
    else  /* 'f' is either greater or less than all integers */
      return f > 0;  /* greater? */
  }
}